

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

optional<std::string> * __thiscall
Commands::find_entity_name_abi_cxx11_
          (optional<std::string> *__return_storage_ptr__,Commands *this,EntityType type)

{
  bool bVar1;
  reference v;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  *pair;
  const_iterator __end1;
  const_iterator __begin1;
  transparent_map<std::string,_EntityType> *__range1;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  EntityType local_1a;
  Commands *pCStack_18;
  EntityType type_local;
  Commands *this_local;
  
  local_1a = type;
  pCStack_18 = this;
  this_local = (Commands *)__return_storage_ptr__;
  if (type == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"NONE",&local_41);
    std::experimental::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
             ::begin(&this->entities);
    pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
              ::end(&this->entities);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&pair), bVar1) {
      v = std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
          ::operator*(&__end1);
      if (v->second == local_1a) {
        std::experimental::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(__return_storage_ptr__,&v->first);
        return __return_storage_ptr__;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
      ::operator++(&__end1);
    }
    std::experimental::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> Commands::find_entity_name(EntityType type) const
{
    if(type == 0)
        return std::string("NONE");

    for(auto& pair : this->entities)
    {
        if(pair.second == type)
            return pair.first;
    }

    return nullopt;
}